

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sequence_info.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateSequenceInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CreateSequenceInfo *this)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  ::std::operator<<(local_198,"CREATE");
  if ((this->super_CreateInfo).on_conflict == REPLACE_ON_CONFLICT) {
    ::std::operator<<(local_198," OR REPLACE");
  }
  if ((this->super_CreateInfo).temporary == true) {
    ::std::operator<<(local_198," TEMPORARY");
  }
  ::std::operator<<(local_198," SEQUENCE ");
  if ((this->super_CreateInfo).on_conflict == IGNORE_ON_CONFLICT) {
    ::std::operator<<(local_198," IF NOT EXISTS ");
  }
  if ((this->super_CreateInfo).temporary == true) {
    ::std::__cxx11::string::string((string *)&local_1e8,anon_var_dwarf_4b0ffdd + 9,&local_1e9);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_1e8,(string *)&(this->super_CreateInfo).catalog)
    ;
  }
  ParseInfo::QualifierToString(&local_1c8,&local_1e8,&(this->super_CreateInfo).schema,&this->name);
  ::std::operator<<(local_198,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  poVar1 = ::std::operator<<(local_198," INCREMENT BY ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_198," MINVALUE ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_198," MAXVALUE ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_198," START ");
  ::std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = ::std::operator<<(local_198," ");
  pcVar2 = "NO CYCLE";
  if (this->cycle != false) {
    pcVar2 = "CYCLE";
  }
  poVar1 = ::std::operator<<(poVar1,pcVar2);
  ::std::operator<<(poVar1,";");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string CreateSequenceInfo::ToString() const {
	std::stringstream ss;
	ss << "CREATE";
	if (on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
		ss << " OR REPLACE";
	}
	if (temporary) {
		ss << " TEMPORARY";
	}
	ss << " SEQUENCE ";
	if (on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT) {
		ss << " IF NOT EXISTS ";
	}
	ss << QualifierToString(temporary ? "" : catalog, schema, name);
	ss << " INCREMENT BY " << increment;
	ss << " MINVALUE " << min_value;
	ss << " MAXVALUE " << max_value;
	ss << " START " << start_value;
	ss << " " << (cycle ? "CYCLE" : "NO CYCLE") << ";";
	return ss.str();
}